

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

int skynet_sendname(skynet_context *context,uint32_t source,char *addr,int type,int session,
                   void *data,size_t sz)

{
  int iVar1;
  ulong uVar2;
  remote_message *rmsg_00;
  remote_message *rmsg;
  void *pvStack_38;
  uint32_t des;
  void *data_local;
  int session_local;
  int type_local;
  char *addr_local;
  skynet_context *psStack_18;
  uint32_t source_local;
  skynet_context *context_local;
  
  addr_local._4_4_ = source;
  if (source == 0) {
    addr_local._4_4_ = context->handle;
  }
  pvStack_38 = data;
  data_local._0_4_ = session;
  data_local._4_4_ = type;
  _session_local = addr;
  psStack_18 = context;
  if (*addr == ':') {
    uVar2 = strtoul(addr + 1,(char **)0x0,0x10);
    rmsg._4_4_ = (uint32_t)uVar2;
  }
  else {
    if (*addr != '.') {
      _filter_args(context,type,(int *)&data_local,&stack0xffffffffffffffc8,&sz);
      rmsg_00 = (remote_message *)malloc(0x28);
      copy_name((char *)rmsg_00,_session_local);
      (rmsg_00->destination).handle = 0;
      rmsg_00->message = pvStack_38;
      rmsg_00->sz = sz;
      skynet_harbor_send(rmsg_00,addr_local._4_4_,(int)data_local);
      return (int)data_local;
    }
    rmsg._4_4_ = skynet_handle_findname(addr + 1);
    if (rmsg._4_4_ == 0) {
      if ((data_local._4_4_ & 0x10000) != 0) {
        free(pvStack_38);
      }
      return -1;
    }
  }
  iVar1 = skynet_send(psStack_18,addr_local._4_4_,rmsg._4_4_,data_local._4_4_,(int)data_local,
                      pvStack_38,sz);
  return iVar1;
}

Assistant:

int
skynet_sendname(struct skynet_context * context, uint32_t source, const char * addr , int type, int session, void * data, size_t sz) {
	if (source == 0) {
		source = context->handle;
	}
	uint32_t des = 0;
	if (addr[0] == ':') {
		des = strtoul(addr+1, NULL, 16);
	} else if (addr[0] == '.') {
		des = skynet_handle_findname(addr + 1);
		if (des == 0) {
			if (type & PTYPE_TAG_DONTCOPY) {
				skynet_free(data);
			}
			return -1;
		}
	} else {
		_filter_args(context, type, &session, (void **)&data, &sz);

		struct remote_message * rmsg = skynet_malloc(sizeof(*rmsg));
		copy_name(rmsg->destination.name, addr);
		rmsg->destination.handle = 0;
		rmsg->message = data;
		rmsg->sz = sz;

		skynet_harbor_send(rmsg, source, session);
		return session;
	}

	return skynet_send(context, source, des, type, session, data, sz);
}